

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O1

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderFieldMask
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  AlphaNum *b;
  PathSinkCallback *in_R8;
  StringPiece SVar1;
  StringPiece paths;
  char *local_f8;
  undefined8 local_f0;
  AlphaNum local_c8;
  string local_98;
  string local_78;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  if (data->type_ == TYPE_STRING) {
    SVar1 = DataPiece::str(data);
    paths.ptr_ = (char *)SVar1.length_;
    local_58 = (undefined8 *)0x0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58 = (undefined8 *)operator_new(0x10);
    *local_58 = RenderOneFieldPath;
    local_58[1] = ow;
    pcStack_40 = std::
                 _Function_handler<google::protobuf::util::Status_(google::protobuf::StringPiece),_std::_Bind<google::protobuf::util::Status_(*(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>))(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_google::protobuf::StringPiece)>_>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<google::protobuf::util::Status_(google::protobuf::StringPiece),_std::_Bind<google::protobuf::util::Status_(*(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::_Placeholder<1>))(google::protobuf::util::converter::ProtoStreamObjectWriter_*,_google::protobuf::StringPiece)>_>
               ::_M_manager;
    paths.length_ = (stringpiece_ssize_type)&local_58;
    DecodeCompactFieldMaskPaths(__return_storage_ptr__,(converter *)SVar1.ptr_,paths,in_R8);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
  }
  else if (data->type_ == TYPE_NULL) {
    Status::Status(__return_storage_ptr__);
  }
  else {
    local_f8 = "Invalid data type for field mask, value is ";
    local_f0 = 0x2b;
    b = (AlphaNum *)0x0;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_(&local_98,data,(StringPiece)ZEXT816(0x352cac));
    local_c8.piece_data_ = local_98._M_dataplus._M_p;
    local_c8.piece_size_ = local_98._M_string_length;
    StrCat_abi_cxx11_(&local_78,(protobuf *)&local_f8,&local_c8,b);
    SVar1.length_ = local_78._M_string_length;
    SVar1.ptr_ = local_78._M_dataplus._M_p;
    if ((long)local_78._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_78._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,SVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderFieldMask(ProtoStreamObjectWriter* ow,
                                                const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for field mask, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  // TODO(tsun): figure out how to do proto descriptor based snake case
  // conversions as much as possible. Because ToSnakeCase sometimes returns the
  // wrong value.
  return DecodeCompactFieldMaskPaths(data.str(),
                                     std::bind(&RenderOneFieldPath, ow, _1));
}